

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  char cVar2;
  CTState *cts;
  ulong uVar3;
  ushort uVar4;
  RecordFFData *pRVar5;
  ushort uVar6;
  uint uVar7;
  IRType IVar8;
  TRef TVar9;
  uint uVar10;
  CTSize CVar11;
  TRef TVar12;
  GCcdata *pGVar13;
  CType *pCVar14;
  CType *pCVar15;
  cTValue *pcVar16;
  byte bVar17;
  TRef *pTVar18;
  CTypeID sid;
  CType *pCVar19;
  int iVar20;
  uint64_t u64;
  CTInfo CVar21;
  GCobj *o;
  IRRef1 IVar22;
  uint uVar23;
  ptrdiff_t ofs;
  CTSize fofs;
  TRef local_64;
  uint64_t local_50;
  RecordFFData *local_48;
  CType *local_40;
  uint local_34;
  
  local_64 = *J->base;
  local_50 = 0x10;
  pGVar13 = argv2cdata(J,local_64,rd->argv);
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  pCVar19 = cts->tab;
  uVar7 = pCVar19[pGVar13->ctypeid].info;
  pCVar15 = pCVar19 + pGVar13->ctypeid;
  local_48 = rd;
  if ((uVar7 & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar15->size;
    if ((~uVar7 & 0x20800000) == 0) {
      pCVar15 = pCVar19 + (uVar7 & 0xffff);
    }
    (J->fold).ins.field_0.ot = (ushort)(*pCVar1 == 8) * 4 + 0x4505;
    (J->fold).ins.field_0.op1 = (IRRef1)local_64;
    (J->fold).ins.field_0.op2 = 0x17;
    TVar9 = lj_opt_fold(J);
    local_50 = 0;
    local_64 = crec_reassoc_ofs((jit_State *)&((J->cur).ir)->field_0,J->flags,
                                (ptrdiff_t *)(ulong)TVar9,(MSize)&local_50);
  }
LAB_0015b761:
  uVar7 = J->base[1];
  if ((uVar7 >> 0x18 & 0x1e) - 0xe < 6) {
    uVar7 = lj_opt_narrow_cindex(J,uVar7);
    if ((pCVar15->info & 0xe0000000) != 0x20000000) goto LAB_0015bb5e;
LAB_0015ba81:
    uVar10 = pCVar15->info;
    if ((uVar10 >> 0x1a & 1) != 0) {
      TVar9 = lj_ir_kint64(J,1);
      (J->fold).ins.field_0.ot = 0x2115;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      uVar7 = lj_opt_fold(J);
      uVar10 = (uint)(ushort)pCVar15->info;
    }
    local_40 = (CType *)(ulong)(uVar10 & 0xffff);
    CVar11 = lj_ctype_size(cts,uVar10 & 0xffff);
    TVar9 = crec_reassoc_ofs((jit_State *)&((J->cur).ir)->field_0,J->flags,(ptrdiff_t *)(ulong)uVar7
                             ,(MSize)&local_50);
    TVar12 = lj_ir_kint64(J,(ulong)CVar11);
    (J->fold).ins.field_0.ot = 0x2b15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    uVar7 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)local_64;
    local_64 = lj_opt_fold(J);
    pCVar19 = local_40;
    rd = local_48;
  }
  else {
    IVar22 = (IRRef1)uVar7;
    if ((uVar7 & 0x1f000000) != 0x4000000) {
      if ((uVar7 & 0x1f000000) == 0xa000000) {
        pCVar19 = cts->tab + *(ushort *)((rd->argv[1].u64 & 0x7fffffffffff) + 10);
        IVar8 = crec_ct2irt(cts,pCVar19);
        if (((pCVar15->info & 0xe0000000) == 0x20000000) && (IRT_NUM < IVar8)) {
          uVar6 = 0x4500;
          if (pCVar19->size == 8) {
            IVar22 = 0x19;
          }
          else if (pCVar19->size == 4) {
            IVar22 = 0x18;
          }
          else {
            TVar9 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar22;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            uVar7 = lj_opt_fold(J);
            uVar6 = 0x4600;
            IVar22 = 0;
          }
          (J->fold).ins.field_0.ot = uVar6 | (ushort)IVar8;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
          (J->fold).ins.field_0.op2 = IVar22;
          uVar7 = lj_opt_fold(J);
          if ((pCVar19->size < 8) && ((pCVar19->info & 0x800000) == 0)) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b150ab3;
            uVar7 = lj_opt_fold(J);
          }
          goto LAB_0015ba81;
        }
      }
      goto LAB_0015bb5e;
    }
    o = (GCobj *)(rd->argv[1].u64 & 0x7fffffffffff);
    if ((pGVar13 != (GCcdata *)0x0) && (pGVar13->ctypeid == 0x16)) {
      uVar10 = (uint)pGVar13[1].nextgc.gcptr64;
      crec_constructor(J,(GCcdata *)(ulong)uVar10,local_64);
      pCVar15 = cts->tab + uVar10;
      rd = local_48;
    }
    if ((pCVar15->info & 0xf0000000) != 0x10000000) {
      if (((pCVar15->info & 0xf4000000) == 0x34000000) && ((o->str).len == 2)) {
        cVar2 = (char)(o->gch).gclist.gcptr64;
        if (cVar2 == 'i') {
          if (*(char *)((long)&(o->gch).gclist.gcptr64 + 1) == 'm') goto LAB_0015b96c;
        }
        else if ((cVar2 == 'r') && (*(char *)((long)&(o->gch).gclist.gcptr64 + 1) == 'e')) {
LAB_0015b96c:
          TVar9 = lj_ir_kgc(J,o,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = IVar22;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          lj_opt_fold(J);
          if ((char)(o->gch).gclist.gcptr64 == 'i') {
            local_50 = local_50 + (pCVar15->size >> 1);
          }
          pCVar19 = (CType *)(ulong)(ushort)pCVar15->info;
          goto LAB_0015bb53;
        }
      }
      goto LAB_0015bb5e;
    }
    pCVar14 = lj_ctype_getfieldq(cts,pCVar15,&o->str,&local_34,(CTInfo *)0x0);
    pCVar19 = (CType *)0x0;
    if (pCVar14 != (CType *)0x0) {
      u64 = local_34 + local_50;
      local_50 = u64;
      local_40 = pCVar14;
      TVar9 = lj_ir_kgc(J,o,IRT_STR);
      pCVar19 = local_40;
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = IVar22;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      lj_opt_fold(J);
      CVar21 = pCVar19->info;
      if (CVar21 >> 0x1c == 10) {
        if (u64 != 0) {
          TVar9 = lj_ir_kint64(J,u64);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)local_64;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          local_64 = lj_opt_fold(J);
          CVar21 = pCVar19->info;
        }
        uVar7 = CVar21 >> 0x10 & 0x7f;
        iVar20 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar20 == 0; iVar20 = iVar20 + -1) {
          }
        }
        uVar6 = ((ushort)iVar20 ^ 0x1f) * 2 ^ 0x3e;
        uVar23 = CVar21 & 0x800000;
        uVar4 = (ushort)(uVar23 >> 0x10);
        (J->fold).ins.field_0.ot = uVar6 + (uVar4 >> 7) + 0x460f;
        (J->fold).ins.field_0.op1 = (IRRef1)local_64;
        (J->fold).ins.field_0.op2 = 0;
        TVar9 = lj_opt_fold(J);
        pRVar5 = local_48;
        uVar7 = CVar21 & 0x7f;
        uVar10 = CVar21 >> 8 & 0x7f;
        bVar17 = (byte)uVar10;
        IVar22 = (IRRef1)TVar9;
        if (local_48->data != 0) {
          iVar20 = 3;
          if ((CVar21 >> 0x1b & 1) == 0) {
            iVar20 = 10 - (uint)(uVar23 == 0);
          }
          uVar6 = uVar6 + (uVar4 >> 7) + 0xf;
          uVar10 = ~(-1 << (bVar17 & 0x1f)) << ((byte)uVar7 & 0x1f);
          TVar9 = crec_ct_tv(J,(CType *)((ulong)(uint)(iVar20 * 0x18) +
                                        **(long **)&J[-1].penalty[0x3c].val),0,J->base[2],
                             local_48->argv + 2);
          TVar12 = lj_ir_kint(J,uVar7);
          (J->fold).ins.field_0.ot = 0x2413;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          TVar9 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,uVar10);
          (J->fold).ins.field_0.ot = uVar6 | 0x2100;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          TVar9 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,~uVar10);
          (J->fold).ins.field_0.ot = uVar6 | 0x2100;
          (J->fold).ins.field_0.op1 = IVar22;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          TVar12 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = uVar6 | 0x2200;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          TVar9 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = uVar6 | 0x4e00;
          (J->fold).ins.field_0.op1 = (IRRef1)local_64;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          lj_opt_fold(J);
          pRVar5->nres = 0;
          J->needsnap = '\x01';
          return;
        }
        if ((CVar21 >> 0x1b & 1) == 0) {
          if (uVar23 == 0) {
            iVar20 = 0x20 - uVar10;
            TVar9 = lj_ir_kint(J,iVar20 - uVar7);
            (J->fold).ins.field_0.ot = 0x2413;
            (J->fold).ins.field_0.op1 = IVar22;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            TVar9 = lj_opt_fold(J);
            TVar12 = lj_ir_kint(J,iVar20);
            IVar22 = (IRRef1)TVar12;
            (J->fold).ins.field_0.ot = 0x2613;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          }
          else {
            TVar9 = lj_ir_kint(J,uVar7);
            (J->fold).ins.field_0.ot = 0x2513;
            (J->fold).ins.field_0.op1 = IVar22;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            TVar9 = lj_opt_fold(J);
            TVar12 = lj_ir_kint(J,~(-1 << (bVar17 & 0x1f)));
            IVar22 = (IRRef1)TVar12;
            (J->fold).ins.field_0.ot = 0x2113;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          }
          (J->fold).ins.field_0.op2 = IVar22;
          TVar9 = lj_opt_fold(J);
        }
        else {
          TVar9 = lj_ir_kint(J,1 << ((byte)uVar7 & 0x1f));
          (J->fold).ins.field_0.ot = 0x2113;
          (J->fold).ins.field_0.op1 = IVar22;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          TVar9 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x993;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          J->postproc = LJ_POST_FIXGUARD;
          TVar9 = 0x2007ffd;
        }
        pTVar18 = J->base;
      }
      else {
        if (CVar21 >> 0x1c != 0xb) {
          pCVar19 = (CType *)(ulong)(CVar21 & 0xffff);
          rd = local_48;
          goto LAB_0015bb53;
        }
        uVar7 = pCVar19->size;
        if (((int)uVar7 < 0) && ((cts->tab[CVar21 & 0xffff].info & 0x800000) != 0)) {
          TVar9 = lj_ir_knum_u64(J,(uint64_t)(double)uVar7);
        }
        else {
          TVar9 = lj_ir_kint(J,uVar7);
        }
        pTVar18 = J->base;
      }
      goto LAB_0015c26a;
    }
  }
LAB_0015bb53:
  sid = (CTypeID)pCVar19;
  if (sid != 0) {
    if (local_50 != 0) {
      TVar9 = lj_ir_kint64(J,local_50);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      local_64 = lj_opt_fold(J);
    }
    pCVar15 = cts->tab + ((ulong)pCVar19 & 0xffffffff);
    if ((pCVar15->info & 0xf0800000) == 0x20800000) {
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x46090000;
      local_64 = lj_opt_fold(J);
      uVar6 = (ushort)pCVar15->info;
      sid = (CTypeID)uVar6;
      pCVar15 = cts->tab + uVar6;
    }
    if (rd->data != 0) {
      rd->nres = 0;
      J->needsnap = '\x01';
      crec_ct_tv(J,pCVar15,local_64,J->base[2],rd->argv + 2);
      return;
    }
    TVar9 = crec_tv_ct(J,pCVar15,sid,local_64);
    pTVar18 = J->base;
LAB_0015c26a:
    *pTVar18 = TVar9;
    return;
  }
LAB_0015bb5e:
  pCVar19 = cts->tab;
  if ((((pCVar15->info & 0xf0000000) != 0x20000000) ||
      (uVar10 = pCVar15->info & 0xffff, (pCVar19[uVar10].info & 0xf0000000) != 0x10000000)) ||
     (pGVar13 = (GCcdata *)0x0, pCVar15 = pCVar19 + uVar10, (uVar7 & 0x1f000000) != 0x4000000)) {
    pcVar16 = lj_ctype_meta(cts,(int)((ulong)((long)pCVar15 - (long)pCVar19) >> 3) * -0x55555555,
                            (uint)(rd->data != 0));
    if (pcVar16 != (cTValue *)0x0) {
      uVar3 = pcVar16->u64;
      if ((long)uVar3 >> 0x2f == -9) {
        TVar9 = lj_ir_kgc(J,(GCobj *)(uVar3 & 0x7fffffffffff),IRT_FUNC);
        pTVar18 = J->base;
        pTVar18[-2] = TVar9;
        pTVar18[-1] = 0x10000;
        rd->nres = -1;
        return;
      }
      if ((((long)uVar3 >> 0x2f == -0xc) && (rd->data == 0)) &&
         ((J->base[1] & 0x1f000000) == 0x4000000)) {
        pcVar16 = lj_tab_get(J->L,(GCtab *)(uVar3 & 0x7fffffffffff),rd->argv + 1);
        TVar9 = lj_record_constify(J,pcVar16);
        pTVar18 = J->base;
        *pTVar18 = TVar9;
        if (TVar9 != 0) {
          TVar9 = pTVar18[1];
          TVar12 = lj_ir_kgc(J,(GCobj *)(rd->argv[1].u64 & 0x7fffffffffff),IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          return;
        }
      }
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  goto LAB_0015b761;
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}